

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cpp
# Opt level: O0

Cursor * __thiscall Table::tableStart(Table *this)

{
  Cursor *pCVar1;
  char *node_00;
  uint32_t *puVar2;
  uint32_t numCells;
  char *node;
  Cursor *c;
  Table *this_local;
  
  pCVar1 = (Cursor *)operator_new(0x18);
  pCVar1->table = this;
  pCVar1->pageNum = this->rootPageNum;
  pCVar1->cellNum = 0;
  node_00 = Pager::getPage(this->pager,this->rootPageNum);
  puVar2 = leaf_node_num_cells(node_00);
  pCVar1->endOfTable = *puVar2 == 0;
  return pCVar1;
}

Assistant:

Cursor* Table::tableStart() {
	Cursor *c = new Cursor;
	c->table = this;
	c->pageNum = rootPageNum;
	c->cellNum = 0;

	char *node = pager->getPage(rootPageNum);
	uint32_t numCells = *leaf_node_num_cells(node);

	c->endOfTable = (numCells == 0);
	return c;
}